

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_InternalParse
          (CodeGeneratorResponse_File *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  string *psVar4;
  GeneratedCodeInfo *msg;
  uint uVar5;
  char *pcVar6;
  undefined8 *puVar7;
  UnknownFieldSet *unknown;
  byte *pbVar8;
  Arena *arena;
  internal *this_01;
  char cVar9;
  uint res;
  pair<const_char_*,_unsigned_int> pVar10;
  StringPiece str;
  byte *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  char *field_name;
  char *size;
  
  local_50 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->content_;
    local_40 = &this->insertion_point_;
    local_48 = &this->name_;
    do {
      bVar1 = *local_50;
      res = (uint)bVar1;
      pbVar8 = local_50 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar8 * 0x80) - 0x80;
        if ((char)*pbVar8 < '\0') {
          pVar10 = internal::ReadTagFallback((char *)local_50,res);
          pbVar8 = (byte *)pVar10.first;
          res = pVar10.second;
        }
        else {
          pbVar8 = local_50 + 2;
        }
      }
      uVar5 = res >> 3;
      field_name = (char *)(ulong)uVar5;
      cVar9 = (char)res;
      local_50 = pbVar8;
      if (uVar5 < 0xf) {
        if (uVar5 == 1) {
          if (cVar9 != '\n') goto LAB_002830d1;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar7 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_48,puVar7);
          local_50 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_50,ctx);
          this_01 = (internal *)(psVar4->_M_dataplus)._M_p;
          size = (char *)psVar4->_M_string_length;
          if ((long)size < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"string length exceeds max size");
          }
          pcVar6 = "google.protobuf.compiler.CodeGeneratorResponse.File.name";
        }
        else {
          if ((uVar5 != 2) || (cVar9 != '\x12')) goto LAB_002830d1;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar7 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            puVar7 = (undefined8 *)*puVar7;
          }
          psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_40,puVar7);
          local_50 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_50,ctx);
          this_01 = (internal *)(psVar4->_M_dataplus)._M_p;
          size = (char *)psVar4->_M_string_length;
          if ((long)size < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"string length exceeds max size");
          }
          pcVar6 = "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point";
        }
LAB_002830bf:
        str.length_ = (size_type)pcVar6;
        str.ptr_ = size;
        internal::VerifyUTF8(this_01,str,field_name);
      }
      else {
        if (uVar5 == 0xf) {
          if (cVar9 == 'z') {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
            uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
            puVar7 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              puVar7 = (undefined8 *)*puVar7;
            }
            psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar7);
            local_50 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_50,ctx);
            this_01 = (internal *)(psVar4->_M_dataplus)._M_p;
            size = (char *)psVar4->_M_string_length;
            if ((long)size < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        ((size_t)size,"string length exceeds max size");
            }
            pcVar6 = "google.protobuf.compiler.CodeGeneratorResponse.File.content";
            goto LAB_002830bf;
          }
        }
        else if ((uVar5 == 0x10) && (cVar9 == -0x7e)) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          msg = this->generated_code_info_;
          if (msg == (GeneratedCodeInfo *)0x0) {
            arena = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              arena = *(Arena **)arena;
            }
            msg = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo>(arena);
            this->generated_code_info_ = msg;
          }
          local_50 = (byte *)internal::ParseContext::ParseMessage
                                       (ctx,(MessageLite *)msg,(char *)local_50);
          goto joined_r0x00283114;
        }
LAB_002830d1:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar8 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar8;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_50 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_50,ctx);
      }
joined_r0x00283114:
      if (local_50 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_50;
}

Assistant:

const char* CodeGeneratorResponse_File::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string insertion_point = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_insertion_point();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.insertion_point");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string content = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          auto str = _internal_mutable_content();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.File.content");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
      case 16:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 130)) {
          ptr = ctx->ParseMessage(_internal_mutable_generated_code_info(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}